

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_mixer_pp.c
# Opt level: O0

void draw(void)

{
  ALLEGRO_BITMAP *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  float disp;
  float scale;
  float db;
  float db_r;
  float db_l;
  float dy;
  float dx;
  float dh;
  float dw;
  float sh;
  float sw;
  undefined4 local_2c;
  undefined4 local_28;
  
  iVar2 = al_get_bitmap_width(bmp);
  iVar3 = al_get_bitmap_height(bmp);
  iVar4 = al_get_bitmap_width(dbuf);
  iVar5 = al_get_bitmap_height(dbuf);
  if ((rms_l <= 0.0) || (rms_r <= 0.0)) {
    local_2c = 0.0;
    local_28 = 0.0;
  }
  else {
    dVar6 = log10((double)rms_l / 2e-05);
    dVar7 = log10((double)rms_r / 2e-05);
    local_28 = (((float)(dVar6 * 20.0) + (float)(dVar7 * 20.0)) / 2.0) / 20.0;
    local_2c = (rms_l + rms_r) * 200.0;
  }
  al_set_target_bitmap();
  al_set_blender();
  al_get_bitmap_width(dbuf);
  al_get_bitmap_height(dbuf);
  al_map_rgba_f();
  al_draw_filled_rectangle();
  al_set_blender(0,1,3);
  pAVar1 = bmp;
  uVar9 = 0x3e99999a;
  uVar10 = 0;
  uVar8 = al_map_rgba_f();
  al_draw_tinted_scaled_rotated_bitmap
            (uVar8,uVar9,CONCAT44(uVar10,(float)iVar2 * 0.5),(float)iVar3 * 0.5,(float)iVar4 / 2.0,
             (float)iVar5 / 2.0 - local_2c,local_28,pAVar1,0);
  al_set_blender(0,1);
  al_set_target_backbuffer(display);
  al_draw_bitmap(dbuf,0);
  al_set_blender(0,2,3);
  al_map_rgb_f();
  al_draw_line();
  al_map_rgb_f();
  al_draw_line();
  al_flip_display();
  theta = -(rms_l + rms_r) * 0.1 + theta;
  return;
}

Assistant:

static void draw(void)
{
   const float sw = al_get_bitmap_width(bmp);
   const float sh = al_get_bitmap_height(bmp);
   const float dw = al_get_bitmap_width(dbuf);
   const float dh = al_get_bitmap_height(dbuf);
   const float dx = dw / 2.0;
   const float dy = dh / 2.0;
   float db_l;
   float db_r;
   float db;
   float scale;
   float disp;

   /* Whatever looks okay. */
   if (rms_l > 0.0 && rms_r > 0.0) {
      db_l = 20 * log10(rms_l / 20e-6);
      db_r = 20 * log10(rms_r / 20e-6);
      db = (db_l + db_r) / 2.0;
      scale = db / 20.0;
      disp = (rms_l + rms_r) * 200.0;
   }
   else {
      db_l = db_r = db = scale = disp = 0.0;
   }

   al_set_target_bitmap(dbuf);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
   al_draw_filled_rectangle(0, 0, al_get_bitmap_width(dbuf), al_get_bitmap_height(dbuf),
      al_map_rgba_f(0.8, 0.3, 0.1, 0.06));
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   al_draw_tinted_scaled_rotated_bitmap(bmp,
      al_map_rgba_f(0.8, 0.3, 0.1, 0.2),
      sw/2.0, sh/2.0, dx, dy - disp, scale, scale, theta, 0);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
   al_set_target_backbuffer(display);
   al_draw_bitmap(dbuf, 0, 0, 0);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
   al_draw_line(10, dh - db_l, 10, dh, al_map_rgb_f(1, 0.6, 0.2), 6);
   al_draw_line(20, dh - db_r, 20, dh, al_map_rgb_f(1, 0.6, 0.2), 6);

   al_flip_display();

   theta -= (rms_l + rms_r) * 0.1;
}